

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clikit.h
# Opt level: O1

void __thiscall
clikit::ProcessOptions::operator()
          (ProcessOptions *this,
          vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
          *optionDefinitions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type *pvVar2;
  pointer pcVar3;
  pointer pOVar4;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_> *pvVar5;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  _Var6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  value_type *__x;
  pointer pOVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  pointer __x_00;
  anon_class_16_2_6c671130 __f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_> *local_b0;
  pointer local_a8;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  Option local_68;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x_00 = (optionDefinitions->
           super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_a8 = (optionDefinitions->
             super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = optionDefinitions;
  if (__x_00 != local_a8) {
    do {
      pvVar2 = (__x_00->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (__x_00->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_c8,__x);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,&__x_00->names);
      pcVar3 = (__x_00->usage)._M_dataplus._M_p;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar3,pcVar3 + (__x_00->usage)._M_string_length);
      Usage::add((Usage *)usage,&local_80,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      __x_00 = __x_00 + 1;
    } while (__x_00 != local_a8);
  }
  pvVar5 = local_b0;
  _Var6 = std::operator()((local_b0->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (local_b0->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var6._M_current !=
      (pvVar5->
      super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    if (((_Var6._M_current)->lambda).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00107395:
      std::__throw_bad_function_call();
      goto LAB_0010739a;
    }
    (*((_Var6._M_current)->lambda)._M_invoker)
              ((_Any_data *)&(_Var6._M_current)->lambda,&(this->_firstArgs).arguments);
  }
  _Var6 = std::operator()((pvVar5->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (pvVar5->
                          super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var6._M_current !=
      (pvVar5->
      super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_68.name.field_2;
    local_68.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Bad options","");
    local_68.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __f.badOption = &local_68;
    __f.definedOptions = &local_c8;
    std::operator()((this->_commandLine).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->_commandLine).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,__f);
    if (local_68.arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_68.arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (((_Var6._M_current)->lambda).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0010739a:
        uVar7 = std::__throw_bad_function_call();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        _Unwind_Resume(uVar7);
      }
      (*((_Var6._M_current)->lambda)._M_invoker)
                ((_Any_data *)&(_Var6._M_current)->lambda,&local_68.arguments);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68.arguments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  pOVar8 = (this->_options).super__Vector_base<clikit::Option,_std::allocator<clikit::Option>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar4 = (this->_options).super__Vector_base<clikit::Option,_std::allocator<clikit::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pOVar8 == pOVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      return;
    }
    _Var6 = std::operator()((pvVar5->
                            super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (pvVar5->
                            super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
                            )._M_impl.super__Vector_impl_data._M_finish,pOVar8);
    if (_Var6._M_current !=
        (pvVar5->
        super__Vector_base<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      if (((_Var6._M_current)->lambda).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00107395;
      }
      (*((_Var6._M_current)->lambda)._M_invoker)
                ((_Any_data *)&(_Var6._M_current)->lambda,&pOVar8->arguments);
    }
    pOVar8 = pOVar8 + 1;
  } while( true );
}

Assistant:

void operator()(vector<OptionDefinition> optionDefinitions)
        {
            vector<string> definedOptions;

            // List defined options to know when to call "Bad Options"
            for (auto& option : optionDefinitions)
            {
                for (auto& name : option.names)
                {
                    definedOptions.push_back(name);
                }

                usage.add(option.names, option.usage);
            }

            // Check if "First args" is present
            auto firstArgsItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "First args") != definition.names.end();
            });

            if (firstArgsItr != optionDefinitions.end())
            {
                firstArgsItr->lambda(_firstArgs.arguments);
            }

            // Check if "Bad Options" is present
            auto badOptionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "Bad options") != definition.names.end();
            });

            if (badOptionItr != optionDefinitions.end())
            {
                Option badOption{ "Bad options" };

                // List bad options names as "Bad Options" arguments
                for_each(_commandLine.begin(), _commandLine.end(), [&](string& arg)
                {
                    if (arg[0] == '-' && find(ALL(definedOptions), arg) == definedOptions.end())
                    {
                        badOption.arguments.push_back(arg);
                    }
                });

                // Run "Bad Options" lambda
                if (badOption.arguments.size())
                {
                    badOptionItr->lambda(badOption.arguments);
                }
            }

            // Process valid options
            for (auto& option : _options)
            {
                // For each defined options found in argv
                auto definitionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
                {
                    return find_if(ALL(definition.names), 
                        [&](const string& definitionName) 
                        { 
                            return option.name == definitionName; 
                        }) != definition.names.end();
                });

                // Run option lambda
                if (definitionItr != optionDefinitions.end())
                {
                    definitionItr->lambda(option.arguments);
                }
            }
        }